

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O1

void __thiscall
bezier::Bezier<3UL>::Bezier
          (Bezier<3UL> *this,vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> *controlPoints)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pVVar4;
  long lVar5;
  ulong uVar6;
  
  (this->mControlPoints)._M_elems[3].x = 0.0;
  (this->mControlPoints)._M_elems[3].y = 0.0;
  (this->mControlPoints)._M_elems[2].x = 0.0;
  (this->mControlPoints)._M_elems[2].y = 0.0;
  (this->mControlPoints)._M_elems[1].x = 0.0;
  (this->mControlPoints)._M_elems[1].y = 0.0;
  (this->mControlPoints)._M_elems[0].x = 0.0;
  (this->mControlPoints)._M_elems[0].y = 0.0;
  if ((long)(controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>)._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>)._M_impl
            .super__Vector_impl_data._M_start == 0x40) {
    pVVar4 = (controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>)._M_impl.
        super__Vector_impl_data._M_finish != pVVar4) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pVVar4->x + lVar5);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(this->mControlPoints)._M_elems[0].x + lVar5);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        uVar6 = uVar6 + 1;
        pVVar4 = (controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < (ulong)((long)(controlPoints->
                                     super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4
                              ));
    }
    return;
  }
  __assert_fail("controlPoints.size() == size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/include/bezier/bezier.h"
                ,0x278,"bezier::Bezier<3>::Bezier(const std::vector<Point> &) [N = 3]");
}

Assistant:

explicit Bezier(const std::vector<Point>& controlPoints)
        {
            assert(controlPoints.size() == size()); // The bezier curve must be initialized with the expected number of points
            for (size_t i = 0; i < controlPoints.size(); i++)
                mControlPoints[i] = Point(controlPoints[i]);
        }